

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::entity_first_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions,bool isLdf)

{
  pointer ppeVar1;
  size_t sVar2;
  long lVar3;
  v_array<unsigned_long> *pvVar4;
  v_array<unsigned_long> *extraout_RDX;
  v_array<unsigned_long> *extraout_RDX_00;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 + 1;
    auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar8._0_8_ = lVar3;
    auVar8._12_4_ = 0x45300000;
    dVar7 = SQRT((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) + -1.0;
    pvVar4 = (v_array<unsigned_long> *)(long)dVar7;
    uVar6 = (long)(dVar7 - 9.223372036854776e+18) & (long)pvVar4 >> 0x3f | (ulong)pvVar4;
    uVar5 = 0;
    do {
      if (uVar5 < uVar6 >> 1) {
        sVar2 = predict_entity(sch,ppeVar1[uVar5],pvVar4,(ptag)uVar5,isLdf);
        pvVar4 = extraout_RDX;
      }
      else {
        sVar2 = predict_relation(sch,ppeVar1[uVar5],predictions,(ptag)uVar5,isLdf);
        pvVar4 = extraout_RDX_00;
      }
      predictions->_begin[uVar5] = sVar2;
      uVar5 = uVar5 + 1;
      ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3));
  }
  return;
}

Assistant:

void entity_first_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions, bool isLdf = false)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;
  // Do entity recognition first
  for (size_t i = 0; i < ec.size(); i++)
  {
    if (i < n_ent)
      predictions[i] = predict_entity(sch, ec[i], predictions, (ptag)i, isLdf);
    else
      predictions[i] = predict_relation(sch, ec[i], predictions, (ptag)i, isLdf);
  }
}